

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O3

MusInfo * MOD_OpenSong(FileReader *reader)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  IT_SAMPLE *pIVar8;
  void *pvVar9;
  BYTE *pBVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DUMBFILE *f;
  DUH *pDVar12;
  DUMB_IT_SIGDATA *pDVar13;
  input_mod *this;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  sbyte sVar17;
  ushort uVar18;
  uint uVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  char cVar29;
  long lVar30;
  ulong uVar31;
  char cVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  uint lenfull;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  dumbfile_mem_status filestate;
  FString ver;
  anon_union_64_2_a0bbd727 anon_var_0;
  dumbfile_mem_status local_108;
  ulong local_f8;
  ulong local_f0;
  DUH *local_e8;
  FString local_e0;
  long local_d8;
  int *local_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  int local_b5;
  char cStack_b1;
  undefined4 uStack_b0;
  char local_ab;
  int local_9c;
  ulong local_88;
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (!mod_dumb.Value) {
    return (MusInfo *)0x0;
  }
  addterm(dumb_exit,"dumb_exit");
  lVar30 = reader->Length;
  iVar11 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])(reader);
  local_f0 = CONCAT44(extraout_var,iVar11);
  local_108.offset = 0;
  lenfull = (uint)lVar30;
  uVar20 = 0x40;
  if ((int)lenfull < 0x40) {
    uVar20 = lenfull;
  }
  local_108.ptr = (BYTE *)&local_c8;
  iVar11 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                     (reader,&local_c8,(long)(int)uVar20);
  if (CONCAT44(extraout_var_00,iVar11) != (long)(int)uVar20) {
    return (MusInfo *)0x0;
  }
  if (local_c8 == 0x4d504d49 && 3 < (int)lenfull) {
    f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
    if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
    pDVar12 = dumb_read_it_quick(f);
LAB_00338efb:
    if (pDVar12 == (DUH *)0x0) goto LAB_00338f31;
  }
  else {
    cVar29 = (char)local_c8;
    cVar32 = (char)(local_c8 >> 8);
    if ((int)lenfull < 0x11) {
      if ((int)lenfull < 2) {
LAB_00338db4:
        if (((local_c8 & 0xff0000) == 0x4d0000 && 2 < (int)lenfull) &&
            (cVar32 == 'T' && cVar29 == 'M')) {
          f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
          if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
          pDVar12 = dumb_read_mtm_quick(f);
        }
        else if ((local_c8 == 0x46464952 && 0xb < (int)lenfull) &&
                (((uStack_c0 == 0x20204d41 || (uStack_c0 == 0x464d5344)) ||
                 (uStack_c0 == 0x46464d41)))) {
          f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
          if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
          pDVar12 = dumb_read_riff_quick(f);
        }
        else if ((((int)lenfull < 0x20) ||
                 (auVar40[0] = -(local_c8._3_1_ == 'L'), auVar40[1] = -((char)uStack_c4 == 'U'),
                 auVar40[2] = -(uStack_c4._1_1_ == 'M'), auVar40[3] = -(uStack_c4._2_1_ == ' '),
                 auVar40[4] = -(uStack_c4._3_1_ == 'M'), auVar40[5] = -((char)uStack_c0 == 'u'),
                 auVar40[6] = -(uStack_c0._1_1_ == 's'), auVar40[7] = -(uStack_c0._2_1_ == 'i'),
                 auVar40[8] = -(uStack_c0._3_1_ == 'c'), auVar40[9] = -(cStack_bc == ' '),
                 auVar40[10] = -(cStack_bb == 'F'), auVar40[0xb] = -(cStack_ba == 'o'),
                 auVar40[0xc] = -(cStack_b9 == 'r'), auVar40[0xd] = -(local_b8 == 'm'),
                 auVar40[0xe] = -(cStack_b7 == 'a'), auVar40[0xf] = -(cStack_b6 == 't'),
                 auVar38[0] = -(cVar29 == 'A'), auVar38[1] = -(cVar32 == 'S'),
                 auVar38[2] = -(local_c8._2_1_ == 'Y'), auVar38[3] = -(local_c8._3_1_ == 'L'),
                 auVar38[4] = -((char)uStack_c4 == 'U'), auVar38[5] = -(uStack_c4._1_1_ == 'M'),
                 auVar38[6] = -(uStack_c4._2_1_ == ' '), auVar38[7] = -(uStack_c4._3_1_ == 'M'),
                 auVar38[8] = -((char)uStack_c0 == 'u'), auVar38[9] = -(uStack_c0._1_1_ == 's'),
                 auVar38[10] = -(uStack_c0._2_1_ == 'i'), auVar38[0xb] = -(uStack_c0._3_1_ == 'c'),
                 auVar38[0xc] = -(cStack_bc == ' '), auVar38[0xd] = -(cStack_bb == 'F'),
                 auVar38[0xe] = -(cStack_ba == 'o'), auVar38[0xf] = -(cStack_b9 == 'r'),
                 auVar38 = auVar38 & auVar40,
                 (ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) != 0xffff)) ||
                (cStack_b1 != '0' || local_b5 != 0x2e315620)) {
          f = (DUMBFILE *)0x0;
          if ((((int)lenfull < 8) || (local_c8 != 0x41544b4f)) ||
             (f = (DUMBFILE *)0x0, uStack_c4 != 0x474e4f53)) goto LAB_00338f31;
          f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
          if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
          pDVar12 = dumb_read_okt_quick(f);
        }
        else {
          f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
          if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
          pDVar12 = dumb_read_asy_quick(f);
        }
      }
      else {
        bVar36 = false;
LAB_00338bcf:
        if ((cVar32 == 'f' && cVar29 == 'i') || (cVar32 == 'N' && cVar29 == 'J')) {
          f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
          if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
          pDVar12 = dumb_read_669_quick(f);
        }
        else if ((bool)(bVar36 & local_9c == 0x464d5450)) {
          f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
          if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
          pDVar12 = dumb_read_ptm_quick(f);
        }
        else if (local_c8 == 0x204d5350 && 3 < (int)lenfull) {
          f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
          if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
          pDVar12 = dumb_read_psm_quick(f,0);
        }
        else {
          if (local_c8 != 0xfe4d5350 || (int)lenfull < 4) goto LAB_00338db4;
          f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
          if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
          pDVar12 = dumb_read_old_psm_quick(f);
        }
      }
      goto LAB_00338efb;
    }
    auVar37[0] = -(cVar29 == 'E');
    auVar37[1] = -(cVar32 == 'x');
    auVar37[2] = -(local_c8._2_1_ == 't');
    auVar37[3] = -(local_c8._3_1_ == 'e');
    auVar37[4] = -((char)uStack_c4 == 'n');
    auVar37[5] = -(uStack_c4._1_1_ == 'd');
    auVar37[6] = -(uStack_c4._2_1_ == 'e');
    auVar37[7] = -(uStack_c4._3_1_ == 'd');
    auVar37[8] = -((char)uStack_c0 == ' ');
    auVar37[9] = -(uStack_c0._1_1_ == 'M');
    auVar37[10] = -(uStack_c0._2_1_ == 'o');
    auVar37[0xb] = -(uStack_c0._3_1_ == 'd');
    auVar37[0xc] = -(cStack_bc == 'u');
    auVar37[0xd] = -(cStack_bb == 'l');
    auVar37[0xe] = -(cStack_ba == 'e');
    auVar37[0xf] = -(cStack_b9 == ':');
    auVar39[0] = -(local_b8 == ' ');
    auVar39[1] = 0xff;
    auVar39[2] = 0xff;
    auVar39[3] = 0xff;
    auVar39[4] = 0xff;
    auVar39[5] = 0xff;
    auVar39[6] = 0xff;
    auVar39[7] = 0xff;
    auVar39[8] = 0xff;
    auVar39[9] = 0xff;
    auVar39[10] = 0xff;
    auVar39[0xb] = 0xff;
    auVar39[0xc] = 0xff;
    auVar39[0xd] = 0xff;
    auVar39[0xe] = 0xff;
    auVar39[0xf] = 0xff;
    auVar39 = auVar39 & auVar37;
    if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) != 0xffff) {
      bVar36 = 0x2f < lenfull;
      if (local_9c == 0x4d524353 && bVar36) {
        f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
        if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
        pDVar12 = dumb_read_s3m_quick(f);
      }
      else {
        if (((lenfull < 0x490) || (local_ab != '\x02')) ||
           ((CONCAT44(uStack_b0,CONCAT13(cStack_b1,local_b5._1_3_)) != 0x216d616572635321 &&
            ((CONCAT44(uStack_b0,CONCAT13(cStack_b1,local_b5._1_3_)) != 0x4d545332444f4d42 &&
             (bVar36 = true,
             CONCAT44(uStack_b0,CONCAT13(cStack_b1,local_b5._1_3_)) != 0x21444f4d415a5557))))))
        goto LAB_00338bcf;
        f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
        if (f == (DUMBFILE *)0x0) goto LAB_00338f2f;
        pDVar12 = dumb_read_stm_quick(f);
      }
      goto LAB_00338efb;
    }
    f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
    if (f != (DUMBFILE *)0x0) {
      pDVar12 = dumb_read_xm_quick(f);
      goto LAB_00338efb;
    }
LAB_00338f2f:
    f = (DUMBFILE *)0x0;
LAB_00338f31:
    if (local_108.ptr == (BYTE *)&local_c8) {
      f = dumb_read_allfile(&local_108,(BYTE *)&local_c8,reader,uVar20,lenfull);
      if (f == (DUMBFILE *)0x0) {
        (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,local_f0,0);
        return (MusInfo *)0x0;
      }
      pDVar12 = dumb_read_mod_quick(f,1);
    }
    else {
      local_108.offset = 0;
      pDVar12 = dumb_read_mod_quick(f,1);
      if (f == (DUMBFILE *)0x0) goto LAB_00338f92;
    }
  }
  dumbfile_close(f);
LAB_00338f92:
  iVar11 = mod_autochip_scan_threshold.Value;
  if (pDVar12 == (DUH *)0x0) {
    this = (input_mod *)0x0;
    (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,local_f0,0);
  }
  else {
    local_d8 = CONCAT71(local_d8._1_7_,local_c8 == 0x4d504d49 && 3 < (int)lenfull);
    local_e8 = pDVar12;
    if (mod_autochip.Value == true) {
      local_f0 = CONCAT44(local_f0._4_4_,mod_autochip_size_force.Value);
      local_d0 = (int *)CONCAT44(local_d0._4_4_,mod_autochip_size_scan.Value);
      pDVar13 = duh_get_it_sigdata(pDVar12);
      if ((pDVar13 != (DUMB_IT_SIGDATA *)0x0) && (iVar7 = pDVar13->n_samples, 0 < (long)iVar7)) {
        uVar20 = (int)(iVar11 << 8 | 0x32U) / 100;
        uVar19 = (int)(iVar11 << 0x10 | 0x32U) / 100;
        local_f8 = (ulong)uVar19;
        pIVar8 = pDVar13->sample;
        lVar30 = 0;
        do {
          bVar3 = pIVar8[lVar30].flags;
          if ((bVar3 & 1) != 0) {
            uVar24 = bVar3 & 4;
            iVar11 = pIVar8[lVar30].length;
            if (iVar11 < (int)local_f0) goto LAB_0033906a;
            if (iVar11 < (int)local_d0) {
              uVar33 = ((bVar3 & 4) != 0) + 1;
              uVar14 = (ulong)uVar33;
              if ((bVar3 & 0x50) != 0x10) goto LAB_0033914d;
              sVar17 = (sbyte)(uVar24 >> 2);
              uVar22 = pIVar8[lVar30].loop_start << sVar17;
              iVar35 = pIVar8[lVar30].loop_end << sVar17;
              pvVar9 = pIVar8[lVar30].data;
              lVar26 = (long)(int)uVar22;
              if ((bVar3 & 2) == 0) {
                iVar23 = (int)*(char *)((long)pvVar9 + lVar26) -
                         (int)*(char *)((long)pvVar9 + (long)(int)(iVar35 - uVar33));
                bVar21 = (byte)iVar23;
                bVar27 = -bVar21;
                if (0 < iVar23) {
                  bVar27 = bVar21;
                }
                if ((int)(uint)bVar27 <= (int)uVar20) {
                  if ((bVar3 & 4) != 0) {
                    iVar35 = (int)*(char *)((long)pvVar9 + lVar26 + 1) -
                             (int)*(char *)((long)pvVar9 + (long)iVar35 + -1);
                    bVar21 = (byte)iVar35;
                    bVar27 = -bVar21;
                    if (0 < iVar35) {
                      bVar27 = bVar21;
                    }
                    if (uVar20 < bVar27) goto LAB_0033906a;
                  }
LAB_0033914d:
                  if ((bVar3 & 0xa0) == 0x20) {
                    sVar17 = (sbyte)(uVar24 >> 2);
                    uVar24 = pIVar8[lVar30].sus_loop_start << sVar17;
                    iVar35 = pIVar8[lVar30].sus_loop_end << sVar17;
                    pvVar9 = pIVar8[lVar30].data;
                    lVar26 = (long)(int)uVar24;
                    if ((bVar3 & 2) == 0) {
                      uVar22 = (int)*(char *)((long)pvVar9 + lVar26) -
                               (int)*(char *)((long)pvVar9 + (long)(int)(iVar35 - uVar33));
                      uVar24 = -uVar22;
                      if (0 < (int)uVar22) {
                        uVar24 = uVar22;
                      }
                      if ((int)(uVar24 & 0xff) <= (int)uVar20) {
                        if ((bVar3 & 4) == 0) {
LAB_00339360:
                          sVar17 = 0;
                          goto LAB_003391e4;
                        }
                        uVar22 = (int)*(char *)((long)pvVar9 + lVar26 + 1) -
                                 (int)*(char *)((long)pvVar9 + (long)iVar35 + -1);
                        uVar24 = -uVar22;
                        if (0 < (int)uVar22) {
                          uVar24 = uVar22;
                        }
                        if ((uVar24 & 0xff) <= uVar20) goto LAB_003391e4;
                      }
                    }
                    else {
                      uVar28 = (int)*(short *)((long)pvVar9 + lVar26 * 2) -
                               (int)*(short *)((long)pvVar9 + (long)(int)(iVar35 - uVar33) * 2);
                      uVar22 = -uVar28;
                      if (0 < (int)uVar28) {
                        uVar22 = uVar28;
                      }
                      if ((int)(uVar22 & 0xffff) <= (int)uVar19) {
                        if ((bVar3 & 4) == 0) goto LAB_00339360;
                        uVar22 = (int)*(short *)((long)pvVar9 + (long)(int)(uVar24 | 1) * 2) -
                                 (int)*(short *)((long)pvVar9 + (long)iVar35 * 2 + -2);
                        uVar24 = -uVar22;
                        if (0 < (int)uVar22) {
                          uVar24 = uVar22;
                        }
                        if ((uVar24 & 0xffff) <= uVar19) goto LAB_003391e4;
                      }
                    }
                  }
                  else {
                    sVar17 = (sbyte)(uVar24 >> 2);
LAB_003391e4:
                    if ((bVar3 & 0x10) != 0) {
                      iVar11 = pIVar8[lVar30].loop_end;
                    }
                    uVar24 = iVar11 << sVar17;
                    uVar15 = (ulong)uVar24;
                    uVar34 = uVar14;
                    if ((bVar3 & 2) == 0) {
                      if ((int)uVar33 < (int)uVar24) {
                        lVar26 = 0;
                        do {
                          uVar22 = (int)*(char *)((long)pIVar8[lVar30].data + lVar26) -
                                   (int)*(char *)((long)pIVar8[lVar30].data + uVar34);
                          uVar33 = -uVar22;
                          if (0 < (int)uVar22) {
                            uVar33 = uVar22;
                          }
                          if ((int)uVar20 < (int)(uVar33 & 0xff)) goto LAB_0033906a;
                          uVar34 = uVar34 + uVar14;
                          lVar26 = lVar26 + uVar14;
                        } while (uVar34 < uVar15);
                      }
                      if (((bVar3 & 4) != 0) && (uVar34 = 3, 3 < (int)uVar24)) {
                        uVar34 = 3;
                        do {
                          iVar11 = (int)*(char *)((long)pIVar8[lVar30].data + (uVar34 - 2)) -
                                   (int)*(char *)((long)pIVar8[lVar30].data + uVar34);
                          bVar3 = (byte)iVar11;
                          bVar21 = -bVar3;
                          if (0 < iVar11) {
                            bVar21 = bVar3;
                          }
                        } while (((int)(uint)bVar21 <= (int)uVar20) &&
                                (uVar34 = uVar34 + 2, uVar34 < uVar15));
                      }
                    }
                    else {
                      if ((int)uVar33 < (int)uVar24) {
                        lVar26 = 0;
                        do {
                          uVar22 = (int)*(short *)((long)pIVar8[lVar30].data + lVar26 * 2) -
                                   (int)*(short *)((long)pIVar8[lVar30].data + uVar34 * 2);
                          uVar33 = -uVar22;
                          if (0 < (int)uVar22) {
                            uVar33 = uVar22;
                          }
                          if ((int)uVar19 < (int)(uVar33 & 0xffff)) goto LAB_0033906a;
                          uVar34 = uVar34 + uVar14;
                          lVar26 = lVar26 + uVar14;
                        } while (uVar34 < uVar15);
                      }
                      if (((bVar3 & 4) != 0) && (uVar34 = 3, 3 < (int)uVar24)) {
                        uVar34 = 3;
                        do {
                          iVar11 = (int)*(short *)((long)pIVar8[lVar30].data + uVar34 * 2 + -4) -
                                   (int)*(short *)((long)pIVar8[lVar30].data + uVar34 * 2);
                          uVar4 = (ushort)iVar11;
                          uVar18 = -uVar4;
                          if (0 < iVar11) {
                            uVar18 = uVar4;
                          }
                        } while (((int)(uint)uVar18 <= (int)uVar19) &&
                                (uVar34 = uVar34 + 2, uVar34 < uVar15));
                      }
                    }
                    if ((int)uVar24 <= (int)uVar34) goto LAB_00339325;
                  }
                }
              }
              else {
                uVar25 = (int)*(short *)((long)pvVar9 + lVar26 * 2) -
                         (int)*(short *)((long)pvVar9 + (long)(int)(iVar35 - uVar33) * 2);
                uVar28 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar28 = uVar25;
                }
                if ((int)(uVar28 & 0xffff) <= (int)uVar19) {
                  if ((bVar3 & 4) != 0) {
                    iVar35 = (int)*(short *)((long)pvVar9 + (long)(int)(uVar22 | 1) * 2) -
                             (int)*(short *)((long)pvVar9 + (long)iVar35 * 2 + -2);
                    uVar4 = (ushort)iVar35;
                    uVar18 = -uVar4;
                    if (0 < iVar35) {
                      uVar18 = uVar4;
                    }
                    if (uVar19 < uVar18) goto LAB_0033906a;
                  }
                  goto LAB_0033914d;
                }
              }
LAB_0033906a:
              pIVar8[lVar30].max_resampling_quality = 0;
            }
          }
LAB_00339325:
          lVar30 = lVar30 + 1;
        } while (lVar30 != iVar7);
      }
    }
    this = (input_mod *)operator_new(0x88);
    input_mod::input_mod(this,local_e8);
    iVar11 = (*(this->super_StreamSong).super_MusInfo._vptr_MusInfo[10])(this);
    pDVar12 = local_e8;
    pBVar10 = local_108.ptr;
    if ((char)iVar11 == '\0') {
      (*(this->super_StreamSong).super_MusInfo._vptr_MusInfo[1])(this);
      this = (input_mod *)0x0;
    }
    else if ((char)local_d8 == '\0') {
      pDVar13 = duh_get_it_sigdata(local_e8);
      if (pDVar13 != (DUMB_IT_SIGDATA *)0x0) {
        uVar1 = pDVar13->n_patterns;
        uVar2 = pDVar13->n_pchannels;
        this->NumChannels = uVar2;
        this->NumPatterns = uVar1;
        this->NumOrders = pDVar13->n_orders;
        pcVar16 = duh_get_tag(pDVar12,"FORMAT");
        FString::operator=(&this->Codec,pcVar16);
        pcVar16 = duh_get_tag(pDVar12,"TRACKERVERSION");
        FString::operator=(&this->TrackerVersion,pcVar16);
        pcVar16 = duh_get_tag(pDVar12,"FORMATVERSION");
        FString::operator=(&this->FormatVersion,pcVar16);
      }
    }
    else if (((((0xff < lenfull && (int *)local_108.ptr != (int *)0x0) &&
               (*(int *)local_108.ptr == 0x4d504d49)) &&
              (*(ushort *)((long)local_108.ptr + 0x22) < 0x100)) &&
             ((0xf05f < (ushort)(*(ushort *)((long)local_108.ptr + 0x24) - 0xfa1) &&
              (*(ushort *)((long)local_108.ptr + 0x20) != 0)))) &&
            ((uint)*(ushort *)((long)local_108.ptr + 0x20) +
             ((uint)*(ushort *)((long)local_108.ptr + 0x24) +
              (uint)*(ushort *)((long)local_108.ptr + 0x22) & 0x3fff) * 4 +
             (uint)*(ushort *)((long)local_108.ptr + 0x26) * 4 + 0xc0 <= (lenfull & 0x7fffffff))) {
      local_e0.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      FString::Format(&local_e0,"IT v%u.%02x",(ulong)(*(ushort *)((long)local_108.ptr + 0x2a) >> 8),
                      (ulong)*(ushort *)((long)local_108.ptr + 0x2a) & 0xff);
      FString::operator=(&this->Codec,&local_e0);
      FString::Format(&local_e0,"%u.%02x",(ulong)(*(ushort *)((long)pBVar10 + 0x28) >> 8),
                      (ulong)*(ushort *)((long)pBVar10 + 0x28) & 0xff);
      FString::operator=(&this->TrackerVersion,&local_e0);
      uVar4 = *(ushort *)((long)pBVar10 + 0x20);
      local_80 = (ulong)uVar4;
      uVar18 = *(ushort *)((long)pBVar10 + 0x26);
      local_88 = (ulong)uVar18;
      uVar14 = (ulong)((uint)uVar4 + (uint)uVar18 * 4) +
               (ulong)((uint)*(ushort *)((long)pBVar10 + 0x24) +
                      (uint)*(ushort *)((long)pBVar10 + 0x22)) * 4 + 0xc0;
      uVar20 = (uint)uVar14;
      if (uVar20 < lenfull) {
        uVar19 = uVar20 + (uint)*(ushort *)((long)pBVar10 + uVar14) * 8 + 2;
        uVar14 = (ulong)(uVar20 + 2);
        if (uVar19 < lenfull) {
          uVar14 = (ulong)uVar19;
        }
      }
      uVar34 = uVar14 + 0x1320;
      if ((ulong)(lenfull & 0x7fffffff) <= uVar14 + 0x1320) {
        uVar34 = uVar14;
      }
      if ((*(byte *)((long)pBVar10 + 0x2c) & 0x80) == 0) {
        uVar34 = uVar14;
      }
      uVar20 = (uint)uVar34;
      uVar19 = uVar20 + 8;
      if ((uVar19 < lenfull) && (*(int *)((long)pBVar10 + uVar34) == 0x4d414e50)) {
        iVar11 = *(int *)((long)pBVar10 + uVar34 + 4);
        uVar24 = iVar11 + uVar19;
        uVar20 = uVar19;
        if (iVar11 - 0x20U < 0x1de1) {
          uVar20 = uVar24;
        }
        if (lenfull < uVar24) {
          uVar20 = uVar19;
        }
        uVar19 = uVar20 + 8;
      }
      local_f0 = 0;
      if ((uVar19 < lenfull) && (*(int *)((long)pBVar10 + (ulong)uVar20) == 0x4d414e43)) {
        uVar20 = *(uint *)((long)pBVar10 + (ulong)uVar20 + 4);
        local_f0 = (ulong)uVar20 / 0x14;
        if (0x4ec < uVar20 - 0x14) {
          local_f0 = 0;
        }
        if (lenfull < uVar19 + uVar20) {
          local_f0 = 0;
        }
      }
      if (uVar18 != 0) {
        local_d8 = (long)pBVar10 +
                   (ulong)*(ushort *)((long)pBVar10 + 0x24) * 4 +
                   (ulong)*(ushort *)((long)pBVar10 + 0x22) * 4 + local_80 + 0xc0;
        local_d0 = (int *)((long)pBVar10 + 8);
        uVar14 = 0;
        do {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          uVar20 = *(uint *)(local_d8 + uVar14 * 4);
          uVar34 = (ulong)uVar20;
          if ((uVar20 + 4 < lenfull && uVar34 != 0) &&
             (uVar5 = *(ushort *)((long)pBVar10 + uVar34 + 2), 0xff02 < (ushort)(uVar5 - 0x101))) {
            uVar6 = *(ushort *)((long)pBVar10 + uVar34);
            pDVar12 = (DUH *)(ulong)uVar6;
            if (uVar20 + uVar6 + 8 <= lenfull) {
              local_f8 = (long)pBVar10 + uVar34;
              uVar20 = 0;
              uVar15 = 0;
              do {
                local_e8 = pDVar12;
                if (((uint)uVar5 <= (uint)uVar15) || (uVar6 <= uVar20)) break;
                lVar30 = 0;
                while( true ) {
                  uVar31 = (ulong)uVar20 + lVar30 + 1;
                  bVar3 = *(byte *)((long)local_d0 + lVar30 + uVar20 + uVar34);
                  if (bVar3 != 0) break;
                  if (((uint)uVar5 <= (uint)uVar15 + (int)lVar30 + 1) ||
                     (lVar30 = lVar30 + 1, uVar6 <= uVar31)) goto LAB_00339623;
                }
                uVar19 = bVar3 - 1 & 0x3f;
                if ((bVar3 & 0x7f) == 0) {
                  uVar19 = bVar3 & 0x7f;
                }
                if ((char)bVar3 < '\0') {
                  if ((uint)uVar6 <= (uint)uVar31) break;
                  bVar3 = *(byte *)(local_f8 + 8 + (uVar31 & 0xffffffff));
                  local_78[uVar19] = bVar3;
                  uVar31 = (ulong)(uVar20 + (int)lVar30 + 2);
                }
                else {
                  bVar3 = local_78[uVar19];
                }
                uVar15 = (uVar15 & 0xffffffff) + lVar30;
                uVar20 = uVar19 + 1;
                if (uVar19 < (uint)local_f0) {
                  uVar20 = (uint)local_f0;
                }
                if ((bVar3 & 0xf) != 0) {
                  local_f0 = (ulong)uVar20;
                }
                uVar20 = (uint)(bVar3 >> 2 & 2) +
                         (uint)(bVar3 >> 1 & 1) + (uint)(bVar3 & 1) + (int)uVar31 +
                         (uint)((bVar3 >> 2 & 1) != 0);
              } while (uVar20 < uVar6);
            }
          }
LAB_00339623:
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_88);
      }
      this->NumChannels = (int)local_f0;
      this->NumPatterns = (uint)uVar18;
      this->NumOrders = (uint)uVar4;
      FString::~FString(&local_e0);
    }
  }
  if ((int *)local_108.ptr != (int *)0x0 && local_108.ptr != (BYTE *)&local_c8) {
    operator_delete__(local_108.ptr);
    return (MusInfo *)this;
  }
  return (MusInfo *)this;
}

Assistant:

MusInfo *MOD_OpenSong(FileReader &reader)
{
	DUH *duh = 0;
	int headsize;
	union
	{
		BYTE start[64];
		DWORD dstart[64/4];
	};
	dumbfile_mem_status filestate;
	DUMBFILE *f = NULL;
	long fpos = 0;
	input_mod *state = NULL;

	if (!mod_dumb)
	{
		return NULL;
	}

	bool is_it = false;
	bool is_dos = true;

	atterm(dumb_exit);

    int size = reader.GetLength();
    fpos = reader.Tell();

	filestate.ptr = start;
	filestate.offset = 0;
	headsize = MIN((int)sizeof(start), size);

    if (headsize != reader.Read(start, headsize))
    {
        return NULL;
    }

	if (size >= 4 && dstart[0] == MAKE_ID('I','M','P','M'))
	{
		is_it = true;
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_it_quick(f);
		}
	}
	else if (size >= 17 && !memcmp(start, "Extended Module: ", 17))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_xm_quick(f);
		}
	}
	else if (size >= 0x30 && dstart[11] == MAKE_ID('S','C','R','M'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_s3m_quick(f);
		}
	}
	else if (size >= 1168 &&
		/*start[28] == 0x1A &&*/ start[29] == 2 &&
		( !memcmp( &start[20], "!Scream!", 8 ) ||
		  !memcmp( &start[20], "BMOD2STM", 8 ) ||
		  !memcmp( &start[20], "WUZAMOD!", 8 ) ) )
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_stm_quick(f);
		}
	}
	else if (size >= 2 &&
		((start[0] == 0x69 && start[1] == 0x66) ||
		 (start[0] == 0x4A && start[1] == 0x4E)))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_669_quick(f);
		}
	}
	else if (size >= 0x30 && dstart[11] == MAKE_ID('P','T','M','F'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_ptm_quick(f);
		}
	}
	else if (size >= 4 && dstart[0] == MAKE_ID('P','S','M',' '))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_psm_quick(f, 0/*start_order*/);
			/*start_order = 0;*/
		}
	}
	else if (size >= 4 && dstart[0] == (DWORD)MAKE_ID('P','S','M',254))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_old_psm_quick(f);
		}
	}
	else if (size >= 3 && start[0] == 'M' && start[1] == 'T' && start[2] == 'M')
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_mtm_quick(f);
		}
	}
	else if (size >= 12 && dstart[0] == MAKE_ID('R','I','F','F') &&
		(dstart[2] == MAKE_ID('D','S','M','F') ||
		 dstart[2] == MAKE_ID('A','M',' ',' ') ||
		 dstart[2] == MAKE_ID('A','M','F','F')))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_riff_quick(f);
		}
	}
	else if (size >= 32 &&
		!memcmp( start, "ASYLUM Music Format", 19 ) &&
		!memcmp( start + 19, " V1.0", 5 ) )
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_asy_quick(f);
		}
	}
	else if (size >= 8 &&
		dstart[0] == MAKE_ID('O','K','T','A') &&
		dstart[1] == MAKE_ID('S','O','N','G'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_okt_quick(f);
		}
	}

	if ( ! duh )
	{
		is_dos = false;
		if (filestate.ptr == (BYTE *)start)
		{
			if (!(f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
			{
                reader.Seek(fpos, SEEK_SET);
				return NULL;
			}
		}
		else
		{
			filestate.offset = 0;
		}
		// No way to get the filename, so we can't check for a .mod extension, and
		// therefore, trying to load an old 15-instrument SoundTracker module is not
		// safe. We'll restrict MOD loading to 31-instrument modules with known
		// signatures and let the sound system worry about 15-instrument ones.
		// (Assuming it even supports them)
		duh = dumb_read_mod_quick(f, TRUE);
	}

	if (f != NULL)
	{
		dumbfile_close(f);
	}
	if ( duh )
	{
		if (mod_autochip)
		{
			MOD_SetAutoChip(duh);
		}
		state = new input_mod(duh);
		if (!state->IsValid())
		{
			delete state;
			state = NULL;
		}
		else
		{
			if (is_it) ReadIT(filestate.ptr, size, state, false);
			else ReadDUH(duh, state, false, is_dos);
		}
	}
	else
	{
		// Reposition file pointer for other codecs to do their checks.
        reader.Seek(fpos, SEEK_SET);
	}
	if (filestate.ptr != (BYTE *)start)
	{
		delete[] const_cast<BYTE *>(filestate.ptr);
	}
	return state;
}